

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::setTabVisible(QTabBar *this,int index,bool visible)

{
  QWidget *pQVar1;
  QTabBarPrivate *this_00;
  QTabBarPrivate *this_01;
  ushort uVar2;
  ulong uVar3;
  undefined1 in_DL;
  byte bVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int in_ESI;
  QTabBarPrivate *in_RDI;
  int newindex;
  Tab *tab;
  QTabBarPrivate *d;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffdc;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar6;
  byte bVar7;
  undefined8 uVar5;
  
  uVar6 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  this_00 = d_func((QTabBar *)0x6ae088);
  this_01 = (QTabBarPrivate *)QTabBarPrivate::at(in_RDI,in_stack_ffffffffffffffcc);
  if (this_01 != (QTabBarPrivate *)0x0) {
    bVar7 = (byte)(uVar6 >> 0x18);
    uVar2 = (ushort)((bVar7 & 1) !=
                    (*(byte *)((long)&(this_01->super_QWidgetPrivate).dirty.d + 4) >> 1 & 1));
    *(ushort *)&this_00->field_0x2d0 = *(ushort *)&this_00->field_0x2d0 & 0xfffe | uVar2;
    if ((*(ushort *)&this_00->field_0x2d0 & 1) != 0) {
      bVar4 = (bVar7 & 1) << 1;
      uVar5 = CONCAT71((int7)(CONCAT62((int6)((ulong)extraout_RDX >> 0x10),uVar2) >> 8),bVar4);
      uVar3 = 0;
      *(byte *)((long)&(this_01->super_QWidgetPrivate).dirty.d + 4) =
           *(byte *)((long)&(this_01->super_QWidgetPrivate).dirty.d + 4) & 0xfd | bVar4;
      if ((QWidget *)(this_01->super_QWidgetPrivate).graphicsEffect != (QWidget *)0x0) {
        pQVar1 = (QWidget *)(this_01->super_QWidgetPrivate).graphicsEffect;
        uVar3 = (ulong)(bVar7 & 1);
        (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,bVar7 & 1,uVar5,uVar3);
        uVar5 = extraout_RDX_00;
      }
      if (*(QWidget **)&(this_01->super_QWidgetPrivate).imHints != (QWidget *)0x0) {
        pQVar1 = *(QWidget **)&(this_01->super_QWidgetPrivate).imHints;
        bVar7 = (byte)(uVar6 >> 0x18);
        (**(code **)(*(long *)pQVar1 + 0x68))
                  (pQVar1,bVar7 & 1,uVar5,CONCAT71((int7)(uVar3 >> 8),bVar7) & 0xffffffffffffff01);
      }
      QWidget::setShortcutEnabled
                ((QWidget *)CONCAT44(in_ESI,uVar6),(int)((ulong)this_00 >> 0x20),
                 SUB81((ulong)this_00 >> 0x18,0));
      QTabBarPrivate::calculateFirstLastVisible
                (this_01,(int)((ulong)this_00 >> 0x20),
                 SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0),
                 SUB41((uint)in_stack_ffffffffffffffdc >> 0x10,0));
      if (((uVar6 & 0x1000000) == 0) && (in_ESI == this_00->currentIndex)) {
        QTabBarPrivate::selectNewCurrentIndexFrom(this_01,in_stack_ffffffffffffffdc);
        setCurrentIndex((QTabBar *)this_00,(int)((ulong)this_01 >> 0x20));
      }
      QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void QTabBar::setTabVisible(int index, bool visible)
{
    Q_D(QTabBar);
    if (QTabBarPrivate::Tab *tab = d->at(index)) {
        d->layoutDirty = (visible != tab->visible);
        if (!d->layoutDirty)
            return;
        tab->visible = visible;
        if (tab->leftWidget)
            tab->leftWidget->setVisible(visible);
        if (tab->rightWidget)
            tab->rightWidget->setVisible(visible);
#ifndef QT_NO_SHORTCUT
        setShortcutEnabled(tab->shortcutId, visible);
#endif
        d->calculateFirstLastVisible(index, visible, false);
        if (!visible && index == d->currentIndex) {
            const int newindex = d->selectNewCurrentIndexFrom(index+1);
            setCurrentIndex(newindex);
        }
        update();
    }
}